

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

void type(void)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string str;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\n");
  poVar2 = std::operator<<(poVar2,"======================================================");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"     TYPE                                           ");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"======================================================");
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_28,"Is this string an std::string? ",&local_29);
  std::allocator<char>::~allocator(&local_29);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_28);
  bVar1 = agr::is_str<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Is a string streamable? ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Check if int is in the list (int, double, float): ");
  bVar1 = agr::is_any<int,double,float>();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void type()
 {
  std::cout << "\n" << "======================================================" << "\n"
                      << "     TYPE                                           " << "\n"
                      << "======================================================" << "\n"

                      << "\n";

  // is_str
  std::string str = "Is this string an std::string? ";
  std::cout << str << agr::is_str( str ) << "\n";

  // is_streamable
  std::cout << "Is a string streamable? " << agr::is_streamable <std::ostream, std::string>::value << "\n";

  // is_any
  std::cout << "Check if int is in the list (int, double, float): " << agr::is_any<int, double, float>() << "\n";
 }